

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O3

uint64 google::protobuf::internal::ReadVarint64(char **p)

{
  byte bVar1;
  byte bVar2;
  byte *p_00;
  uint32 res32;
  pair<const_char_*,_unsigned_long> pVar3;
  
  p_00 = (byte *)*p;
  bVar1 = *p_00;
  pVar3.second = (long)(char)bVar1;
  pVar3.first = (char *)(p_00 + 1);
  if ((long)(char)bVar1 < 0) {
    bVar2 = p_00[1];
    res32 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
    if ((char)bVar2 < '\0') {
      pVar3 = VarintParseSlow64((char *)p_00,res32);
    }
    else {
      pVar3.second._0_4_ = res32;
      pVar3.first = (char *)(p_00 + 2);
      pVar3.second._4_4_ = 0;
    }
  }
  *p = pVar3.first;
  return pVar3.second;
}

Assistant:

inline uint64 ReadVarint64(const char** p) {
  uint64 tmp;
  *p = VarintParse(*p, &tmp);
  return tmp;
}